

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintNumberUnsigned(_U_UINT number)

{
  undefined1 auVar1 [16];
  undefined8 local_18;
  _U_UINT divisor;
  _U_UINT number_local;
  
  for (local_18 = 1; 9 < number / local_18; local_18 = local_18 * 10) {
  }
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = number / local_18;
    putchar((int)(char)(SUB161(auVar1 % ZEXT816(10),0) + '0'));
    local_18 = local_18 / 10;
  } while (local_18 != 0);
  return;
}

Assistant:

void UnityPrintNumberUnsigned(const _U_UINT number)
{
    _U_UINT divisor = 1;

    /* figure out initial divisor */
    while (number / divisor > 9)
    {
        divisor *= 10;
    }

    /* now mod and print, then divide divisor */
    do
    {
        UNITY_OUTPUT_CHAR((char)('0' + (number / divisor % 10)));
        divisor /= 10;
    }
    while (divisor > 0);
}